

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O0

void __thiscall vector_digest_test::test_method(vector_digest_test *this)

{
  initializer_list<char> __l;
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  type tVar3;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  cryptox local_80 [8];
  string str;
  undefined1 local_5c [8];
  digest_type hash;
  allocator_type local_3d;
  char local_3c [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<char,_std::allocator<char>_> vector;
  vector_digest_test *this_local;
  
  builtin_strncpy(local_3c,"\x01\x02\x03\x04",4);
  local_38 = local_3c;
  local_30 = 4;
  vector.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this;
  std::allocator<char>::allocator();
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_28,__l,&local_3d);
  std::allocator<char>::~allocator(&local_3d);
  tVar3 = cryptox::
          digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>,std::vector<char,std::allocator<char>>>
                    ((vector<char,_std::allocator<char>_> *)local_28);
  hash._M_elems._0_8_ = tVar3._M_elems._8_8_;
  local_5c = tVar3._M_elems._0_8_;
  cryptox::to_hex<std::array<unsigned_char,16ul>>(local_80,(array<unsigned_char,_16UL> *)local_5c);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x32,&local_a0);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
              (&local_c8,&local_d8,0x32,1,2,local_80,"str","08d6c05a21512a79a1dfeb9d2a8f262f",
               "\"08d6c05a21512a79a1dfeb9d2a8f262f\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_80);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_28)
  ;
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(vector_digest_test) {
	const std::vector<char> vector = { 1, 2, 3, 4 };
	const md5::digest_type hash = digest<md5>(vector);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "08d6c05a21512a79a1dfeb9d2a8f262f");
}